

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::CopyPropagateArrays::IsPointerToArrayType(CopyPropagateArrays *this,uint32_t type_id)

{
  IRContext *this_00;
  bool bVar1;
  int iVar2;
  Type *pTVar3;
  undefined4 extraout_var;
  
  this_00 = (this->super_MemPass).super_Pass.context_;
  if ((this_00->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(this_00);
  }
  pTVar3 = analysis::TypeManager::GetType
                     ((this_00->type_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                      _M_head_impl,type_id);
  iVar2 = (*pTVar3->_vptr_Type[0x21])(pTVar3);
  if (CONCAT44(extraout_var,iVar2) == 0) {
    bVar1 = false;
  }
  else {
    iVar2 = *(int *)(*(long *)(CONCAT44(extraout_var,iVar2) + 0x28) + 0x20);
    bVar1 = iVar2 == 6 || iVar2 == 9;
  }
  return bVar1;
}

Assistant:

bool CopyPropagateArrays::IsPointerToArrayType(uint32_t type_id) {
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  analysis::Pointer* pointer_type = type_mgr->GetType(type_id)->AsPointer();
  if (pointer_type) {
    return pointer_type->pointee_type()->kind() == analysis::Type::kArray ||
           pointer_type->pointee_type()->kind() == analysis::Type::kImage;
  }
  return false;
}